

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
cppcms::json::bad_value_cast::bad_value_cast(bad_value_cast *this,string *s,json_type actual)

{
  ostream *poVar1;
  ostream *in_RDI;
  ostringstream msg;
  bad_cast *in_stack_fffffffffffffe40;
  ostringstream local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  
  booster::bad_cast::bad_cast(in_stack_fffffffffffffe40);
  *(undefined ***)in_RDI = &PTR__bad_value_cast_0052c218;
  *(undefined ***)(in_RDI + 8) = &PTR__bad_value_cast_0052c240;
  std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0," error converting from ");
  json::operator<<(in_RDI,(json_type)((ulong)poVar1 >> 0x20));
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x28),(string *)&stack0xfffffffffffffe40);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

bad_value_cast::bad_value_cast(std::string const &s,json_type actual) : 
		msg_("cppcms::json::bad_cast: " + s)
	{
		std::ostringstream msg;
		msg<<" error converting from "<<actual;
		msg_ +=msg.str();

	}